

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::utilize_exec_list(timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                    *this,timer_type *head)

{
  timer_type **pptVar1;
  timer_object<timertt::thread_safety::unsafe> *ptVar2;
  timer_kind kind;
  bool local_31;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  timer_type *local_20;
  timer_type *t;
  timer_type *head_local;
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  
  t = head;
  head_local = (timer_type *)this;
  while (t != (timer_type *)0x0) {
    local_20 = t;
    pptVar1 = &t->m_next;
    ptVar2 = &t->super_timer_object<timertt::thread_safety::unsafe>;
    local_31 = false;
    t = *pptVar1;
    if (*(int *)&ptVar2->field_0xc == 2) {
      local_28 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
      local_31 = std::chrono::operator!=(&local_28,&local_20->m_period);
    }
    if (local_31 == false) {
      kind = timer_type::kind(local_20);
      engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
      ::dec_timer_count(&this->
                         super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                        ,kind);
      *(undefined4 *)&(local_20->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 0;
      timer_object<timertt::thread_safety::unsafe>::decrement_references
                (&local_20->super_timer_object<timertt::thread_safety::unsafe>);
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::operator+=(&local_20->m_when,&local_20->m_period);
      *(undefined4 *)&(local_20->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 1;
      insert_timer_to_list(this,local_20);
    }
  }
  return;
}

Assistant:

void
	utilize_exec_list(
		//! Head of execution list.
		//! Cannot be null.
		timer_type * head )
	{
		while( head )
		{
			auto t = head;
			head = head->m_next;

			// Actual periodic timer must be rescheduled.
			if( timer_status::wait_for_execution == t->m_status &&
					monotonic_clock::duration::zero() != t->m_period )
			{
				t->m_when += t->m_period;
				t->m_status = timer_status::active;

				insert_timer_to_list( t );
			}
			else
			{
				// Timer must be utilized.
				this->dec_timer_count( t->kind() );
				t->m_status = timer_status::deactivated;
				timer_object< THREAD_SAFETY >::decrement_references( t );
			}
		}
	}